

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

OperandSymbol * __thiscall
ConsistencyChecker::getOperandSymbol(ConsistencyChecker *this,int4 slot,OpTpl *op,Constructor *ct)

{
  const_type cVar1;
  int4 i;
  ConstTpl *pCVar2;
  OperandSymbol *pOStack_38;
  int4 handindex;
  OperandSymbol *opsym;
  VarnodeTpl *vn;
  Constructor *ct_local;
  OpTpl *op_local;
  int4 slot_local;
  ConsistencyChecker *this_local;
  
  if (slot == -1) {
    opsym = (OperandSymbol *)OpTpl::getOut(op);
  }
  else {
    opsym = (OperandSymbol *)OpTpl::getIn(op,slot);
  }
  pCVar2 = VarnodeTpl::getSize((VarnodeTpl *)opsym);
  cVar1 = ConstTpl::getType(pCVar2);
  if (cVar1 == handle) {
    pCVar2 = VarnodeTpl::getSize((VarnodeTpl *)opsym);
    i = ConstTpl::getHandleIndex(pCVar2);
    pOStack_38 = Constructor::getOperand(ct,i);
  }
  else {
    pOStack_38 = (OperandSymbol *)0x0;
  }
  return pOStack_38;
}

Assistant:

OperandSymbol *ConsistencyChecker::getOperandSymbol(int4 slot,OpTpl *op,Constructor *ct)

{
  VarnodeTpl *vn;
  OperandSymbol *opsym;
  int4 handindex;

  if (slot == -1)
    vn = op->getOut();
  else
    vn = op->getIn(slot);
  
  switch(vn->getSize().getType()) {
  case ConstTpl::handle:
    handindex = vn->getSize().getHandleIndex();
    opsym = ct->getOperand(handindex);
    break;
  default:
    opsym = (OperandSymbol *)0;
    break;
  }
  return opsym;
}